

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_small_type_uses.cpp
# Opt level: O1

spv_result_t spvtools::val::ValidateSmallTypeUses(ValidationState_t *_,Instruction *inst)

{
  ushort uVar1;
  uint32_t id;
  pointer ppVar2;
  bool bVar3;
  spv_result_t sVar4;
  spv_result_t sVar5;
  uint uVar6;
  pointer ppVar7;
  spv_result_t local_20c;
  DiagnosticStream local_208;
  
  bVar3 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
  sVar4 = SPV_SUCCESS;
  sVar5 = SPV_SUCCESS;
  if ((((bVar3) && (id = (inst->inst_).type_id, sVar5 = sVar4, id != 0)) &&
      (bVar3 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,id), bVar3)) &&
     (bVar3 = ValidationState_t::IsPointerType(_,(inst->inst_).type_id), !bVar3)) {
    ppVar7 = (inst->uses_).
             super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar2 = (inst->uses_).
             super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar7 != ppVar2) {
      do {
        uVar1 = (ppVar7->first->inst_).opcode;
        bVar3 = true;
        uVar6 = uVar1 - 0x3e;
        if (((0x35 < uVar6) || ((0x38000000200201U >> ((ulong)uVar6 & 0x3f) & 1) == 0)) &&
           (uVar1 != 0x14c)) {
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,ppVar7->first);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_208,"Invalid use of 8- or 16-bit result",0x22);
          local_20c = local_208.error_;
          DiagnosticStream::~DiagnosticStream(&local_208);
          bVar3 = false;
        }
        sVar5 = local_20c;
      } while ((bVar3) && (ppVar7 = ppVar7 + 1, sVar5 = sVar4, ppVar7 != ppVar2));
    }
  }
  return sVar5;
}

Assistant:

spv_result_t ValidateSmallTypeUses(ValidationState_t& _,
                                   const Instruction* inst) {
  if (!_.HasCapability(spv::Capability::Shader) || inst->type_id() == 0 ||
      !_.ContainsLimitedUseIntOrFloatType(inst->type_id())) {
    return SPV_SUCCESS;
  }

  if (_.IsPointerType(inst->type_id())) return SPV_SUCCESS;

  // The validator should previously have checked ways to generate 8- or 16-bit
  // types. So we only need to considervalid paths from source to sink.
  // When restricted, uses of 8- or 16-bit types can only be stores,
  // width-only conversions, decorations and copy object.
  for (auto use : inst->uses()) {
    const auto* user = use.first;
    switch (user->opcode()) {
      case spv::Op::OpDecorate:
      case spv::Op::OpDecorateId:
      case spv::Op::OpCopyObject:
      case spv::Op::OpStore:
      case spv::Op::OpFConvert:
      case spv::Op::OpUConvert:
      case spv::Op::OpSConvert:
        break;
      default:
        return _.diag(SPV_ERROR_INVALID_ID, user)
               << "Invalid use of 8- or 16-bit result";
    }
  }

  return SPV_SUCCESS;
}